

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

void __thiscall
Diligent::TexFormatToVkFormatMapper::TexFormatToVkFormatMapper(TexFormatToVkFormatMapper *this)

{
  memset(this,0,0x1a8);
  this->m_FmtToVkFmtMap[1] = VK_FORMAT_R32G32B32A32_SFLOAT;
  this->m_FmtToVkFmtMap[2] = VK_FORMAT_R32G32B32A32_SFLOAT;
  this->m_FmtToVkFmtMap[3] = VK_FORMAT_R32G32B32A32_UINT;
  this->m_FmtToVkFmtMap[4] = VK_FORMAT_R32G32B32A32_SINT;
  this->m_FmtToVkFmtMap[5] = VK_FORMAT_R32G32B32_SFLOAT;
  this->m_FmtToVkFmtMap[6] = VK_FORMAT_R32G32B32_SFLOAT;
  this->m_FmtToVkFmtMap[7] = VK_FORMAT_R32G32B32_UINT;
  this->m_FmtToVkFmtMap[8] = VK_FORMAT_R32G32B32_SINT;
  this->m_FmtToVkFmtMap[9] = VK_FORMAT_R16G16B16A16_SFLOAT;
  this->m_FmtToVkFmtMap[10] = VK_FORMAT_R16G16B16A16_SFLOAT;
  this->m_FmtToVkFmtMap[0xb] = VK_FORMAT_R16G16B16A16_UNORM;
  this->m_FmtToVkFmtMap[0xc] = VK_FORMAT_R16G16B16A16_UINT;
  this->m_FmtToVkFmtMap[0xd] = VK_FORMAT_R16G16B16A16_SNORM;
  this->m_FmtToVkFmtMap[0xe] = VK_FORMAT_R16G16B16A16_SINT;
  this->m_FmtToVkFmtMap[0xf] = VK_FORMAT_R32G32_SFLOAT;
  this->m_FmtToVkFmtMap[0x10] = VK_FORMAT_R32G32_SFLOAT;
  this->m_FmtToVkFmtMap[0x11] = VK_FORMAT_R32G32_UINT;
  this->m_FmtToVkFmtMap[0x12] = VK_FORMAT_R32G32_SINT;
  this->m_FmtToVkFmtMap[0x13] = VK_FORMAT_D32_SFLOAT_S8_UINT;
  this->m_FmtToVkFmtMap[0x14] = VK_FORMAT_D32_SFLOAT_S8_UINT;
  this->m_FmtToVkFmtMap[0x15] = VK_FORMAT_D32_SFLOAT_S8_UINT;
  this->m_FmtToVkFmtMap[0x17] = VK_FORMAT_A2R10G10B10_UNORM_PACK32;
  this->m_FmtToVkFmtMap[0x18] = VK_FORMAT_A2R10G10B10_UNORM_PACK32;
  this->m_FmtToVkFmtMap[0x19] = VK_FORMAT_A2R10G10B10_UINT_PACK32;
  this->m_FmtToVkFmtMap[0x1a] = VK_FORMAT_B10G11R11_UFLOAT_PACK32;
  this->m_FmtToVkFmtMap[0x1b] = VK_FORMAT_R8G8B8A8_UNORM;
  this->m_FmtToVkFmtMap[0x1c] = VK_FORMAT_R8G8B8A8_UNORM;
  this->m_FmtToVkFmtMap[0x1d] = VK_FORMAT_R8G8B8A8_SRGB;
  this->m_FmtToVkFmtMap[0x1e] = VK_FORMAT_R8G8B8A8_UINT;
  this->m_FmtToVkFmtMap[0x1f] = VK_FORMAT_R8G8B8A8_SNORM;
  this->m_FmtToVkFmtMap[0x20] = VK_FORMAT_R8G8B8A8_SINT;
  this->m_FmtToVkFmtMap[0x21] = VK_FORMAT_R16G16_SFLOAT;
  this->m_FmtToVkFmtMap[0x22] = VK_FORMAT_R16G16_SFLOAT;
  this->m_FmtToVkFmtMap[0x23] = VK_FORMAT_R16G16_UNORM;
  this->m_FmtToVkFmtMap[0x24] = VK_FORMAT_R16G16_UINT;
  this->m_FmtToVkFmtMap[0x25] = VK_FORMAT_R16G16_SNORM;
  this->m_FmtToVkFmtMap[0x26] = VK_FORMAT_R16G16_SINT;
  this->m_FmtToVkFmtMap[0x27] = VK_FORMAT_R32_SFLOAT;
  this->m_FmtToVkFmtMap[0x28] = VK_FORMAT_D32_SFLOAT;
  this->m_FmtToVkFmtMap[0x29] = VK_FORMAT_R32_SFLOAT;
  this->m_FmtToVkFmtMap[0x2a] = VK_FORMAT_R32_UINT;
  this->m_FmtToVkFmtMap[0x2b] = VK_FORMAT_R32_SINT;
  this->m_FmtToVkFmtMap[0x2c] = VK_FORMAT_D24_UNORM_S8_UINT;
  this->m_FmtToVkFmtMap[0x2d] = VK_FORMAT_D24_UNORM_S8_UINT;
  this->m_FmtToVkFmtMap[0x2e] = VK_FORMAT_D24_UNORM_S8_UINT;
  this->m_FmtToVkFmtMap[0x30] = VK_FORMAT_R8G8_UNORM;
  this->m_FmtToVkFmtMap[0x31] = VK_FORMAT_R8G8_UNORM;
  this->m_FmtToVkFmtMap[0x32] = VK_FORMAT_R8G8_UINT;
  this->m_FmtToVkFmtMap[0x33] = VK_FORMAT_R8G8_SNORM;
  this->m_FmtToVkFmtMap[0x34] = VK_FORMAT_R8G8_SINT;
  this->m_FmtToVkFmtMap[0x35] = VK_FORMAT_R16_SFLOAT;
  this->m_FmtToVkFmtMap[0x36] = VK_FORMAT_R16_SFLOAT;
  this->m_FmtToVkFmtMap[0x37] = VK_FORMAT_D16_UNORM;
  this->m_FmtToVkFmtMap[0x38] = VK_FORMAT_R16_UNORM;
  this->m_FmtToVkFmtMap[0x39] = VK_FORMAT_R16_UINT;
  this->m_FmtToVkFmtMap[0x3a] = VK_FORMAT_R16_SNORM;
  this->m_FmtToVkFmtMap[0x3b] = VK_FORMAT_R16_SINT;
  this->m_FmtToVkFmtMap[0x3c] = VK_FORMAT_R8_UNORM;
  this->m_FmtToVkFmtMap[0x3d] = VK_FORMAT_R8_UNORM;
  this->m_FmtToVkFmtMap[0x3e] = VK_FORMAT_R8_UINT;
  this->m_FmtToVkFmtMap[0x3f] = VK_FORMAT_R8_SNORM;
  this->m_FmtToVkFmtMap[0x40] = VK_FORMAT_R8_SINT;
  this->m_FmtToVkFmtMap[0x41] = VK_FORMAT_R8_UNORM;
  this->m_FmtToVkFmtMap[0x43] = VK_FORMAT_E5B9G9R9_UFLOAT_PACK32;
  this->m_FmtToVkFmtMap[0x45] = VK_FORMAT_UNDEFINED;
  this->m_FmtToVkFmtMap[0x46] = VK_FORMAT_BC1_RGB_UNORM_BLOCK;
  this->m_FmtToVkFmtMap[0x47] = VK_FORMAT_BC1_RGB_UNORM_BLOCK;
  this->m_FmtToVkFmtMap[0x48] = VK_FORMAT_BC1_RGB_SRGB_BLOCK;
  this->m_FmtToVkFmtMap[0x49] = VK_FORMAT_BC2_UNORM_BLOCK;
  this->m_FmtToVkFmtMap[0x4a] = VK_FORMAT_BC2_UNORM_BLOCK;
  this->m_FmtToVkFmtMap[0x4b] = VK_FORMAT_BC2_SRGB_BLOCK;
  this->m_FmtToVkFmtMap[0x4c] = VK_FORMAT_BC3_UNORM_BLOCK;
  this->m_FmtToVkFmtMap[0x4d] = VK_FORMAT_BC3_UNORM_BLOCK;
  this->m_FmtToVkFmtMap[0x4e] = VK_FORMAT_BC3_SRGB_BLOCK;
  this->m_FmtToVkFmtMap[0x4f] = VK_FORMAT_BC4_UNORM_BLOCK;
  this->m_FmtToVkFmtMap[0x50] = VK_FORMAT_BC4_UNORM_BLOCK;
  this->m_FmtToVkFmtMap[0x51] = VK_FORMAT_BC4_SNORM_BLOCK;
  this->m_FmtToVkFmtMap[0x52] = VK_FORMAT_BC5_UNORM_BLOCK;
  this->m_FmtToVkFmtMap[0x53] = VK_FORMAT_BC5_UNORM_BLOCK;
  this->m_FmtToVkFmtMap[0x54] = VK_FORMAT_BC5_SNORM_BLOCK;
  this->m_FmtToVkFmtMap[0x55] = VK_FORMAT_B5G6R5_UNORM_PACK16;
  this->m_FmtToVkFmtMap[0x56] = VK_FORMAT_B5G5R5A1_UNORM_PACK16;
  this->m_FmtToVkFmtMap[0x57] = VK_FORMAT_B8G8R8A8_UNORM;
  this->m_FmtToVkFmtMap[0x58] = VK_FORMAT_B8G8R8A8_UNORM;
  this->m_FmtToVkFmtMap[0x5a] = VK_FORMAT_B8G8R8A8_UNORM;
  this->m_FmtToVkFmtMap[0x5b] = VK_FORMAT_B8G8R8A8_SRGB;
  this->m_FmtToVkFmtMap[0x5c] = VK_FORMAT_B8G8R8A8_UNORM;
  this->m_FmtToVkFmtMap[0x5d] = VK_FORMAT_B8G8R8A8_SRGB;
  this->m_FmtToVkFmtMap[0x5e] = VK_FORMAT_BC6H_UFLOAT_BLOCK;
  this->m_FmtToVkFmtMap[0x5f] = VK_FORMAT_BC6H_UFLOAT_BLOCK;
  this->m_FmtToVkFmtMap[0x60] = VK_FORMAT_BC6H_SFLOAT_BLOCK;
  this->m_FmtToVkFmtMap[0x61] = VK_FORMAT_BC7_UNORM_BLOCK;
  this->m_FmtToVkFmtMap[0x62] = VK_FORMAT_BC7_UNORM_BLOCK;
  this->m_FmtToVkFmtMap[99] = VK_FORMAT_BC7_SRGB_BLOCK;
  this->m_FmtToVkFmtMap[100] = VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK;
  this->m_FmtToVkFmtMap[0x65] = VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK;
  this->m_FmtToVkFmtMap[0x66] = VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK;
  this->m_FmtToVkFmtMap[0x67] = VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK;
  this->m_FmtToVkFmtMap[0x68] = VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK;
  this->m_FmtToVkFmtMap[0x69] = VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK;
  return;
}

Assistant:

TexFormatToVkFormatMapper()
    {
        // clang-format off
        m_FmtToVkFmtMap[TEX_FORMAT_UNKNOWN] = VK_FORMAT_UNDEFINED;

        m_FmtToVkFmtMap[TEX_FORMAT_RGBA32_TYPELESS] = VK_FORMAT_R32G32B32A32_SFLOAT;
        m_FmtToVkFmtMap[TEX_FORMAT_RGBA32_FLOAT]    = VK_FORMAT_R32G32B32A32_SFLOAT;
        m_FmtToVkFmtMap[TEX_FORMAT_RGBA32_UINT]     = VK_FORMAT_R32G32B32A32_UINT;
        m_FmtToVkFmtMap[TEX_FORMAT_RGBA32_SINT]     = VK_FORMAT_R32G32B32A32_SINT;

        m_FmtToVkFmtMap[TEX_FORMAT_RGB32_TYPELESS] = VK_FORMAT_R32G32B32_SFLOAT;
        m_FmtToVkFmtMap[TEX_FORMAT_RGB32_FLOAT]    = VK_FORMAT_R32G32B32_SFLOAT;
        m_FmtToVkFmtMap[TEX_FORMAT_RGB32_UINT]     = VK_FORMAT_R32G32B32_UINT;
        m_FmtToVkFmtMap[TEX_FORMAT_RGB32_SINT]     = VK_FORMAT_R32G32B32_SINT;

        m_FmtToVkFmtMap[TEX_FORMAT_RGBA16_TYPELESS] = VK_FORMAT_R16G16B16A16_SFLOAT;
        m_FmtToVkFmtMap[TEX_FORMAT_RGBA16_FLOAT]    = VK_FORMAT_R16G16B16A16_SFLOAT;
        m_FmtToVkFmtMap[TEX_FORMAT_RGBA16_UNORM]    = VK_FORMAT_R16G16B16A16_UNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_RGBA16_UINT]     = VK_FORMAT_R16G16B16A16_UINT;
        m_FmtToVkFmtMap[TEX_FORMAT_RGBA16_SNORM]    = VK_FORMAT_R16G16B16A16_SNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_RGBA16_SINT]     = VK_FORMAT_R16G16B16A16_SINT;

        m_FmtToVkFmtMap[TEX_FORMAT_RG32_TYPELESS] = VK_FORMAT_R32G32_SFLOAT;
        m_FmtToVkFmtMap[TEX_FORMAT_RG32_FLOAT]    = VK_FORMAT_R32G32_SFLOAT;
        m_FmtToVkFmtMap[TEX_FORMAT_RG32_UINT]     = VK_FORMAT_R32G32_UINT;
        m_FmtToVkFmtMap[TEX_FORMAT_RG32_SINT]     = VK_FORMAT_R32G32_SINT;

        m_FmtToVkFmtMap[TEX_FORMAT_R32G8X24_TYPELESS]        = VK_FORMAT_D32_SFLOAT_S8_UINT;
        m_FmtToVkFmtMap[TEX_FORMAT_D32_FLOAT_S8X24_UINT]     = VK_FORMAT_D32_SFLOAT_S8_UINT;
        m_FmtToVkFmtMap[TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS] = VK_FORMAT_D32_SFLOAT_S8_UINT;
        m_FmtToVkFmtMap[TEX_FORMAT_X32_TYPELESS_G8X24_UINT]  = VK_FORMAT_UNDEFINED;

        m_FmtToVkFmtMap[TEX_FORMAT_RGB10A2_TYPELESS] = VK_FORMAT_A2R10G10B10_UNORM_PACK32;
        m_FmtToVkFmtMap[TEX_FORMAT_RGB10A2_UNORM]    = VK_FORMAT_A2R10G10B10_UNORM_PACK32;
        m_FmtToVkFmtMap[TEX_FORMAT_RGB10A2_UINT]     = VK_FORMAT_A2R10G10B10_UINT_PACK32;
        m_FmtToVkFmtMap[TEX_FORMAT_R11G11B10_FLOAT]  = VK_FORMAT_B10G11R11_UFLOAT_PACK32;

        m_FmtToVkFmtMap[TEX_FORMAT_RGBA8_TYPELESS]   = VK_FORMAT_R8G8B8A8_UNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_RGBA8_UNORM]      = VK_FORMAT_R8G8B8A8_UNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_RGBA8_UNORM_SRGB] = VK_FORMAT_R8G8B8A8_SRGB;
        m_FmtToVkFmtMap[TEX_FORMAT_RGBA8_UINT]       = VK_FORMAT_R8G8B8A8_UINT;
        m_FmtToVkFmtMap[TEX_FORMAT_RGBA8_SNORM]      = VK_FORMAT_R8G8B8A8_SNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_RGBA8_SINT]       = VK_FORMAT_R8G8B8A8_SINT;

        m_FmtToVkFmtMap[TEX_FORMAT_RG16_TYPELESS] = VK_FORMAT_R16G16_SFLOAT;
        m_FmtToVkFmtMap[TEX_FORMAT_RG16_FLOAT]    = VK_FORMAT_R16G16_SFLOAT;
        m_FmtToVkFmtMap[TEX_FORMAT_RG16_UNORM]    = VK_FORMAT_R16G16_UNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_RG16_UINT]     = VK_FORMAT_R16G16_UINT;
        m_FmtToVkFmtMap[TEX_FORMAT_RG16_SNORM]    = VK_FORMAT_R16G16_SNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_RG16_SINT]     = VK_FORMAT_R16G16_SINT;

        m_FmtToVkFmtMap[TEX_FORMAT_R32_TYPELESS] = VK_FORMAT_R32_SFLOAT;
        m_FmtToVkFmtMap[TEX_FORMAT_D32_FLOAT]    = VK_FORMAT_D32_SFLOAT;
        m_FmtToVkFmtMap[TEX_FORMAT_R32_FLOAT]    = VK_FORMAT_R32_SFLOAT;
        m_FmtToVkFmtMap[TEX_FORMAT_R32_UINT]     = VK_FORMAT_R32_UINT;
        m_FmtToVkFmtMap[TEX_FORMAT_R32_SINT]     = VK_FORMAT_R32_SINT;

        m_FmtToVkFmtMap[TEX_FORMAT_R24G8_TYPELESS]        = VK_FORMAT_D24_UNORM_S8_UINT;
        m_FmtToVkFmtMap[TEX_FORMAT_D24_UNORM_S8_UINT]     = VK_FORMAT_D24_UNORM_S8_UINT;
        m_FmtToVkFmtMap[TEX_FORMAT_R24_UNORM_X8_TYPELESS] = VK_FORMAT_D24_UNORM_S8_UINT;
        m_FmtToVkFmtMap[TEX_FORMAT_X24_TYPELESS_G8_UINT]  = VK_FORMAT_UNDEFINED;

        m_FmtToVkFmtMap[TEX_FORMAT_RG8_TYPELESS] = VK_FORMAT_R8G8_UNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_RG8_UNORM]    = VK_FORMAT_R8G8_UNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_RG8_UINT]     = VK_FORMAT_R8G8_UINT;
        m_FmtToVkFmtMap[TEX_FORMAT_RG8_SNORM]    = VK_FORMAT_R8G8_SNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_RG8_SINT]     = VK_FORMAT_R8G8_SINT;

        m_FmtToVkFmtMap[TEX_FORMAT_R16_TYPELESS] = VK_FORMAT_R16_SFLOAT;
        m_FmtToVkFmtMap[TEX_FORMAT_R16_FLOAT]    = VK_FORMAT_R16_SFLOAT;
        m_FmtToVkFmtMap[TEX_FORMAT_D16_UNORM]    = VK_FORMAT_D16_UNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_R16_UNORM]    = VK_FORMAT_R16_UNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_R16_UINT]     = VK_FORMAT_R16_UINT;
        m_FmtToVkFmtMap[TEX_FORMAT_R16_SNORM]    = VK_FORMAT_R16_SNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_R16_SINT]     = VK_FORMAT_R16_SINT;

        m_FmtToVkFmtMap[TEX_FORMAT_R8_TYPELESS] = VK_FORMAT_R8_UNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_R8_UNORM]    = VK_FORMAT_R8_UNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_R8_UINT]     = VK_FORMAT_R8_UINT;
        m_FmtToVkFmtMap[TEX_FORMAT_R8_SNORM]    = VK_FORMAT_R8_SNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_R8_SINT]     = VK_FORMAT_R8_SINT;
        // To get the same behaviour as expected for TEX_FORMAT_A8_UNORM we
        // swizzle the components appropriately using the VkImageViewCreateInfo struct
        m_FmtToVkFmtMap[TEX_FORMAT_A8_UNORM]    = VK_FORMAT_R8_UNORM;

        m_FmtToVkFmtMap[TEX_FORMAT_R1_UNORM]    = VK_FORMAT_UNDEFINED;

        m_FmtToVkFmtMap[TEX_FORMAT_RGB9E5_SHAREDEXP] = VK_FORMAT_E5B9G9R9_UFLOAT_PACK32;
        m_FmtToVkFmtMap[TEX_FORMAT_RG8_B8G8_UNORM]   = VK_FORMAT_UNDEFINED;
        m_FmtToVkFmtMap[TEX_FORMAT_G8R8_G8B8_UNORM]  = VK_FORMAT_UNDEFINED;

        // http://www.g-truc.net/post-0335.html
        // http://renderingpipeline.com/2012/07/texture-compression/
        m_FmtToVkFmtMap[TEX_FORMAT_BC1_TYPELESS]   = VK_FORMAT_BC1_RGB_UNORM_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC1_UNORM]      = VK_FORMAT_BC1_RGB_UNORM_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC1_UNORM_SRGB] = VK_FORMAT_BC1_RGB_SRGB_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC2_TYPELESS]   = VK_FORMAT_BC2_UNORM_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC2_UNORM]      = VK_FORMAT_BC2_UNORM_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC2_UNORM_SRGB] = VK_FORMAT_BC2_SRGB_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC3_TYPELESS]   = VK_FORMAT_BC3_UNORM_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC3_UNORM]      = VK_FORMAT_BC3_UNORM_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC3_UNORM_SRGB] = VK_FORMAT_BC3_SRGB_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC4_TYPELESS]   = VK_FORMAT_BC4_UNORM_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC4_UNORM]      = VK_FORMAT_BC4_UNORM_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC4_SNORM]      = VK_FORMAT_BC4_SNORM_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC5_TYPELESS]   = VK_FORMAT_BC5_UNORM_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC5_UNORM]      = VK_FORMAT_BC5_UNORM_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC5_SNORM]      = VK_FORMAT_BC5_SNORM_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_B5G6R5_UNORM]   = VK_FORMAT_B5G6R5_UNORM_PACK16;
        m_FmtToVkFmtMap[TEX_FORMAT_B5G5R5A1_UNORM] = VK_FORMAT_B5G5R5A1_UNORM_PACK16;
        m_FmtToVkFmtMap[TEX_FORMAT_BGRA8_UNORM]    = VK_FORMAT_B8G8R8A8_UNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_BGRX8_UNORM]    = VK_FORMAT_B8G8R8A8_UNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM] = VK_FORMAT_UNDEFINED;
        m_FmtToVkFmtMap[TEX_FORMAT_BGRA8_TYPELESS]   = VK_FORMAT_B8G8R8A8_UNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_BGRA8_UNORM_SRGB] = VK_FORMAT_B8G8R8A8_SRGB;
        m_FmtToVkFmtMap[TEX_FORMAT_BGRX8_TYPELESS]   = VK_FORMAT_B8G8R8A8_UNORM;
        m_FmtToVkFmtMap[TEX_FORMAT_BGRX8_UNORM_SRGB] = VK_FORMAT_B8G8R8A8_SRGB;
        m_FmtToVkFmtMap[TEX_FORMAT_BC6H_TYPELESS] = VK_FORMAT_BC6H_UFLOAT_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC6H_UF16]     = VK_FORMAT_BC6H_UFLOAT_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC6H_SF16]     = VK_FORMAT_BC6H_SFLOAT_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC7_TYPELESS]   = VK_FORMAT_BC7_UNORM_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC7_UNORM]      = VK_FORMAT_BC7_UNORM_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_BC7_UNORM_SRGB] = VK_FORMAT_BC7_SRGB_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_ETC2_RGB8_UNORM]        = VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_ETC2_RGB8_UNORM_SRGB]   = VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_ETC2_RGB8A1_UNORM]      = VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB] = VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_ETC2_RGBA8_UNORM]       = VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK;
        m_FmtToVkFmtMap[TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB]  = VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK;
        // clang-format on
    }